

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryContextTests.cpp
# Opt level: O3

void __thiscall
deqp::egl::QueryContextCase::executeForContext
          (QueryContextCase *this,EGLDisplay display,EGLContext context,EGLSurface surface,
          Config *config)

{
  ostringstream *poVar1;
  Version VVar2;
  bool bVar3;
  EGLint EVar4;
  EGLint EVar5;
  Library *egl;
  int iVar6;
  int iVar7;
  Version version;
  Version local_1b8;
  undefined1 local_1b0 [384];
  
  egl = EglTestContext::getLibrary
                  ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  VVar2 = (Version)((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                    super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1b8 = eglu::getVersion(egl,display);
  (this->super_CallLogWrapper).m_enableLog = true;
  EVar4 = getContextAttrib(this,display,context,0x3028);
  EVar5 = eglu::getConfigAttribInt(egl,display,config->config,0x3028);
  if (EVar4 != EVar5) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = VVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               "  Fail, config ID doesn\'t match the one used to create the context.",0x43);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid config ID");
  }
  local_1b0._0_4_ = 1;
  local_1b0._4_4_ = 2;
  bVar3 = eglu::Version::operator>=(&local_1b8,(Version *)local_1b0);
  if (bVar3) {
    EVar4 = getContextAttrib(this,display,context,0x3097);
    switch(config->apiBits) {
    case 2:
      iVar6 = 0x30a1;
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_0022c5ea_caseD_3:
      iVar6 = 0;
      break;
    case 8:
      iVar6 = 0x30a2;
      break;
    default:
      if (config->apiBits != 0x40) goto switchD_0022c5ea_caseD_3;
    case 1:
    case 4:
      iVar6 = 0x30a0;
    }
    if (EVar4 != iVar6) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = VVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"  Fail, client API type doesn\'t match.",0x26);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid client API type");
    }
  }
  local_1b0._0_4_ = 1;
  local_1b0._4_4_ = 3;
  bVar3 = eglu::Version::operator>=(&local_1b8,(Version *)local_1b0);
  if (bVar3) {
    EVar4 = getContextAttrib(this,display,context,0x3098);
    iVar6 = config->apiBits;
    iVar7 = 1;
    if (iVar6 < 8) {
      if (1 < iVar6 - 1U) {
        if (iVar6 == 4) {
          iVar7 = 2;
        }
        else {
LAB_0022c6e2:
          iVar7 = 0;
        }
      }
    }
    else if (iVar6 != 8) {
      if (iVar6 != 0x40) goto LAB_0022c6e2;
      iVar7 = 3;
    }
    if (EVar4 < iVar7) {
      poVar1 = (ostringstream *)(local_1b0 + 8);
      local_1b0._0_8_ = VVar2;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"  Fail, client API version doesn\'t match.",0x29);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
      tcu::TestContext::setTestResult
                ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                 super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Invalid client API version");
    }
  }
  local_1b0._0_4_ = 1;
  local_1b0._4_4_ = 2;
  bVar3 = eglu::Version::operator>=(&local_1b8,(Version *)local_1b0);
  if (bVar3) {
    EVar4 = getContextAttrib(this,display,context,0x3086);
    iVar6 = config->surfaceTypeBit;
    if (EVar4 == 0x3085 || iVar6 != 2) {
      if (EVar4 == 0x3084 || iVar6 != 1) {
        if (0xfffffffd < EVar4 - 0x3086U || iVar6 != 4) goto LAB_0022c8ab;
        local_1b0._0_8_ = VVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),
                   "  Fail, render buffer should be either EGL_SINGLE_BUFFER or EGL_BACK_BUFFER for a window surface."
                   ,0x61);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_1b0._0_8_ = VVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),
                   "  Fail, render buffer should be EGL_BACK_BUFFER for a pbuffer surface.",0x46);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
    }
    else {
      local_1b0._0_8_ = VVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b0 + 8),
                 "  Fail, render buffer should be EGL_SINGLE_BUFFER for a pixmap surface.",0x47);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    tcu::TestContext::setTestResult
              ((this->super_SingleContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Invalid render buffer");
  }
LAB_0022c8ab:
  (this->super_CallLogWrapper).m_enableLog = false;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = VVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  Pass",6);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  return;
}

Assistant:

void executeForContext (EGLDisplay display, EGLContext context, EGLSurface surface, const Config& config)
	{
		const Library&		egl		= m_eglTestCtx.getLibrary();
		TestLog&			log		= m_testCtx.getLog();
		const eglu::Version	version	= eglu::getVersion(egl, display);

		DE_UNREF(surface);
		enableLogging(true);

		// Config ID
		{
			const EGLint	configID		= getContextAttrib(display, context, EGL_CONFIG_ID);
			const EGLint	surfaceConfigID	= eglu::getConfigAttribInt(egl, display, config.config, EGL_CONFIG_ID);

			if (configID != surfaceConfigID)
			{
				log << TestLog::Message << "  Fail, config ID doesn't match the one used to create the context." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid config ID");
			}
		}

		// Client API type
		if (version >= eglu::Version(1, 2))
		{
			const EGLint	clientType		= getContextAttrib(display, context, EGL_CONTEXT_CLIENT_TYPE);

			if (clientType != getClientTypeFromAPIBit(config.apiBits))
			{
				log << TestLog::Message << "  Fail, client API type doesn't match." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid client API type");
			}
		}

		// Client API version
		if (version >= eglu::Version(1, 3))
		{
			const EGLint	clientVersion	= getContextAttrib(display, context, EGL_CONTEXT_CLIENT_VERSION);

			// \todo [2014-10-21 mika] Query actual supported api version from client api to make this check stricter.
			if (clientVersion < getMinClientMajorVersion(config.apiBits))
			{
				log << TestLog::Message << "  Fail, client API version doesn't match." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid client API version");
			}
		}

		// Render buffer
		if (version >= eglu::Version(1, 2))
		{
			const EGLint	renderBuffer	= getContextAttrib(display, context, EGL_RENDER_BUFFER);

			if (config.surfaceTypeBit == EGL_PIXMAP_BIT && renderBuffer != EGL_SINGLE_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be EGL_SINGLE_BUFFER for a pixmap surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
			else if (config.surfaceTypeBit == EGL_PBUFFER_BIT && renderBuffer != EGL_BACK_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be EGL_BACK_BUFFER for a pbuffer surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
			else if (config.surfaceTypeBit == EGL_WINDOW_BIT && renderBuffer != EGL_SINGLE_BUFFER && renderBuffer != EGL_BACK_BUFFER)
			{
				log << TestLog::Message << "  Fail, render buffer should be either EGL_SINGLE_BUFFER or EGL_BACK_BUFFER for a window surface." << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid render buffer");
			}
		}

		enableLogging(false);

		log << TestLog::Message << "  Pass" << TestLog::EndMessage;
	}